

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbuildmultiphysicsmesh.cpp
# Opt level: O2

void TPZBuildMultiphysicsMesh::AddWrap
               (TPZMultiphysicsElement *mfcel,int matskeleton,
               TPZStack<TPZStack<TPZMultiphysicsElement_*,_7>,_10> *ListGroupEl)

{
  byte bVar1;
  code *pcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  long lVar8;
  TPZCompEl *this;
  long *plVar9;
  TPZGeoEl *pTVar10;
  TPZCompMesh *pTVar11;
  TPZGeoEl *gel;
  TPZCompElHDivBound2<pzshape::TPZShapeQuad> *this_00;
  undefined8 uVar12;
  TPZConnect *this_01;
  TPZCompEl *pTVar13;
  TPZMultiphysicsElement *object;
  int iVar14;
  undefined8 local_108;
  int local_100;
  TPZStack<TPZStack<TPZMultiphysicsElement_*,_7>,_10> *local_f8;
  TPZMultiphysicsElement *local_f0;
  TPZCompMesh *local_e8;
  TPZStack<TPZMultiphysicsElement_*,_7> wrapEl;
  TPZManVector<TPZMultiphysicsElement_*,_7> local_88;
  
  local_f8 = ListGroupEl;
  local_e8 = TPZCompEl::Mesh(&mfcel->super_TPZCompEl);
  this = (TPZCompEl *)0x0;
  lVar8 = (**(code **)(*(long *)&mfcel->super_TPZCompEl + 600))(mfcel,0);
  if (lVar8 != 0) {
    this = (TPZCompEl *)
           __dynamic_cast(lVar8,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo,0);
  }
  plVar9 = (long *)(**(code **)(*(long *)&mfcel->super_TPZCompEl + 600))(mfcel,1);
  iVar3 = (**(code **)(*plVar9 + 0x78))(plVar9);
  pTVar10 = TPZCompEl::Reference(&mfcel->super_TPZCompEl);
  pTVar11 = TPZCompEl::Mesh(&mfcel->super_TPZCompEl);
  if (this != (TPZCompEl *)0x0) {
    iVar14 = pTVar11->fDimModel;
    iVar4 = (**(code **)(*(long *)pTVar10 + 0x210))(pTVar10);
    if (iVar4 == iVar14) {
      wrapEl.super_TPZManVector<TPZMultiphysicsElement_*,_7>.super_TPZVec<TPZMultiphysicsElement_*>.
      fStore = wrapEl.super_TPZManVector<TPZMultiphysicsElement_*,_7>.fExtAlloc;
      wrapEl.super_TPZManVector<TPZMultiphysicsElement_*,_7>.super_TPZVec<TPZMultiphysicsElement_*>.
      fNElements = 0;
      wrapEl.super_TPZManVector<TPZMultiphysicsElement_*,_7>.super_TPZVec<TPZMultiphysicsElement_*>.
      fNAlloc = 0;
      wrapEl.super_TPZManVector<TPZMultiphysicsElement_*,_7>.super_TPZVec<TPZMultiphysicsElement_*>.
      _vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01816378;
      TPZStack<TPZMultiphysicsElement_*,_7>::Push(&wrapEl,mfcel);
      iVar14 = 0;
      local_f0 = mfcel;
      do {
        iVar4 = (**(code **)(*(long *)pTVar10 + 0xf0))(pTVar10);
        if (iVar4 <= iVar14) {
          TPZStack<TPZMultiphysicsElement_*,_7>::TPZStack
                    ((TPZStack<TPZMultiphysicsElement_*,_7> *)&local_88,&wrapEl);
          TPZStack<TPZStack<TPZMultiphysicsElement_*,_7>,_10>::push_back
                    (local_f8,(TPZStack<TPZMultiphysicsElement_*,_7> *)&local_88);
          TPZManVector<TPZMultiphysicsElement_*,_7>::~TPZManVector(&local_88);
          TPZManVector<TPZMultiphysicsElement_*,_7>::~TPZManVector
                    (&wrapEl.super_TPZManVector<TPZMultiphysicsElement_*,_7>);
          return;
        }
        iVar4 = (**(code **)(*(long *)pTVar10 + 0x208))(pTVar10,iVar14);
        iVar5 = (**(code **)(*(long *)pTVar10 + 0x210))(pTVar10);
        if (iVar4 == iVar5 + -1) {
          gel = (TPZGeoEl *)(**(code **)(*(long *)pTVar10 + 0x170))(pTVar10,iVar14,matskeleton);
          uVar6 = (**(code **)(*(long *)this + 0x250))(this,0,iVar14);
          lVar8 = (**(code **)(*(long *)this + 0xa8))(this,uVar6);
          bVar1 = *(byte *)(lVar8 + 0x14);
          pTVar11 = TPZCompEl::Mesh(this);
          pTVar11->fDefaultOrder = (uint)bVar1;
          iVar4 = (**(code **)(*(long *)pTVar10 + 0xc0))(pTVar10,iVar14);
          if (iVar4 == 1) {
            this_00 = (TPZCompElHDivBound2<pzshape::TPZShapeQuad> *)operator_new(0x80);
            pTVar11 = TPZCompEl::Mesh(this);
            TPZCompElHDivBound2<pzshape::TPZShapeLinear>::TPZCompElHDivBound2
                      ((TPZCompElHDivBound2<pzshape::TPZShapeLinear> *)this_00,pTVar11,gel,
                       EHDivStandard);
            uVar7 = (**(code **)(*(long *)this + 0x2f0))(this,iVar14);
            plVar9 = (long *)__dynamic_cast(this_00,&TPZInterpolationSpace::typeinfo,
                                            &TPZCompElHDivBound2<pzshape::TPZShapeLinear>::typeinfo,
                                            0);
            (**(code **)(*plVar9 + 0x2f8))(plVar9,2,uVar7);
          }
          else if (iVar4 == 2) {
            this_00 = (TPZCompElHDivBound2<pzshape::TPZShapeQuad> *)operator_new(0x80);
            pTVar11 = TPZCompEl::Mesh(this);
            TPZCompElHDivBound2<pzshape::TPZShapeTriang>::TPZCompElHDivBound2
                      ((TPZCompElHDivBound2<pzshape::TPZShapeTriang> *)this_00,pTVar11,gel,
                       EHDivStandard);
            uVar7 = (**(code **)(*(long *)this + 0x2f0))(this,iVar14);
            plVar9 = (long *)__dynamic_cast(this_00,&TPZInterpolationSpace::typeinfo,
                                            &TPZCompElHDivBound2<pzshape::TPZShapeTriang>::typeinfo,
                                            0);
            (**(code **)(*plVar9 + 0x2f8))(plVar9,6,uVar7);
          }
          else {
            if (iVar4 != 3) {
              std::operator<<((ostream *)&std::cout,"ElementType not found!");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                         ,0x36c);
            }
            this_00 = (TPZCompElHDivBound2<pzshape::TPZShapeQuad> *)operator_new(0x88);
            pTVar11 = TPZCompEl::Mesh(this);
            TPZCompElHDivBound2<pzshape::TPZShapeQuad>::TPZCompElHDivBound2
                      (this_00,pTVar11,gel,EHDivStandard);
            uVar7 = (**(code **)(*(long *)this + 0x2f0))(this,iVar14);
            plVar9 = (long *)__dynamic_cast(this_00,&TPZInterpolationSpace::typeinfo,
                                            &TPZCompElHDivBound2<pzshape::TPZShapeQuad>::typeinfo,0)
            ;
            (**(code **)(*plVar9 + 0x2f8))(plVar9,8,uVar7);
          }
          uVar12 = (**(code **)(*(long *)this + 0xa0))(this,uVar6);
          this_01 = (TPZConnect *)
                    (**(code **)(*(long *)&(this_00->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                           super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                           super_TPZCompEl + 0xa8))(this_00,0);
          if (this_01->fDependList != (TPZDepend *)0x0) {
            iVar4 = (**(code **)(*(long *)&(this_00->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                           super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                           super_TPZCompEl + 0x90))(this_00);
            if (iVar4 != 1) {
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                         ,0x375);
            }
            TPZConnect::RemoveDepend(this_01);
          }
          (**(code **)(*(long *)&(this_00->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x208))(this_00,0,uVar12);
          pTVar13 = TPZCompMesh::CreateCompEl(local_e8,gel);
          object = (TPZMultiphysicsElement *)
                   __dynamic_cast(pTVar13,&TPZCompEl::typeinfo,&TPZMultiphysicsElement::typeinfo);
          (**(code **)(*(long *)&object->super_TPZCompEl + 0x248))(object,this_00,0);
          pcVar2 = *(code **)(*(long *)&local_f0->super_TPZCompEl + 600);
          if (iVar3 == 0xf) {
            lVar8 = (*pcVar2)(local_f0,1);
            if (lVar8 == 0) {
              local_108 = 0;
            }
            else {
              local_108 = __dynamic_cast(lVar8,&TPZCompEl::typeinfo,&TPZCompElDisc::typeinfo);
            }
            local_100 = iVar14;
            (**(code **)(*(long *)&object->super_TPZCompEl + 0x250))(object,&local_108,1);
          }
          else {
            lVar8 = (*pcVar2)(local_f0,1);
            if (lVar8 == 0) {
              local_108 = 0;
            }
            else {
              local_108 = __dynamic_cast(lVar8,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo
                                        );
            }
            local_100 = iVar14;
            (**(code **)(*(long *)&object->super_TPZCompEl + 0x250))(object,&local_108,1);
          }
          TPZStack<TPZMultiphysicsElement_*,_7>::Push(&wrapEl,object);
        }
        iVar14 = iVar14 + 1;
      } while( true );
    }
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
             ,0x336);
}

Assistant:

void TPZBuildMultiphysicsMesh::AddWrap(TPZMultiphysicsElement *mfcel, int matskeleton, TPZStack< TPZStack<TPZMultiphysicsElement *,7> > &ListGroupEl)
{
    TPZCompMesh *multiMesh = mfcel->Mesh();
    TPZInterpolationSpace *hdivel = dynamic_cast<TPZInterpolationSpace *> (mfcel->Element(0));
    TPZCompEl *cel = dynamic_cast<TPZCompEl *>(mfcel->Element(1));
    MElementType celType = cel->Type();
    
    TPZGeoEl *gel = mfcel->Reference();
    
    int dimMesh = mfcel->Mesh()->Dimension();
    if (!hdivel || !cel || gel->Dimension() != dimMesh) {
        DebugStop();
    }
    
    //wrap element
    TPZStack<TPZMultiphysicsElement *, 7> wrapEl;
    wrapEl.push_back(mfcel);
    
    for (int side = 0; side < gel->NSides(); side++)
    {
        if (gel->SideDimension(side) != gel->Dimension()-1) {
            continue;
        }
        TPZGeoEl *gelbound = gel->CreateBCGeoEl(side, matskeleton);
        TPZInterpolationSpace *intel = dynamic_cast<TPZInterpolationSpace *>(hdivel);
        int loccon = intel->SideConnectLocId(0,side);
        
        //Impose that the skeleton element has the same polynomial order  to the element of side.
        TPZConnect &conside = intel->Connect(loccon);
        int sideorder = conside.Order();
        intel->Mesh()->SetDefaultOrder(sideorder);
                
        TPZInterpolationSpace *bound;
        MElementType elType = gel->Type(side);
        switch(elType)
        {
            case(EOned)://line
            {
                bound = new TPZCompElHDivBound2<pzshape::TPZShapeLinear>(* intel->Mesh(),gelbound);
                int sideorient = intel->GetSideOrient(side);
                TPZCompElHDivBound2<pzshape::TPZShapeLinear> *hdivbound = dynamic_cast< TPZCompElHDivBound2<pzshape::TPZShapeLinear> *>(bound);
                hdivbound->SetSideOrient(pzshape::TPZShapeLinear::NSides-1,sideorient);
                break;
            }
            case(ETriangle)://triangle
            {
                bound = new TPZCompElHDivBound2<pzshape::TPZShapeTriang>(* intel->Mesh(),gelbound);
                int sideorient = intel->GetSideOrient(side);
                TPZCompElHDivBound2<pzshape::TPZShapeTriang> *hdivbound = dynamic_cast< TPZCompElHDivBound2<pzshape::TPZShapeTriang> *>(bound);
                hdivbound->SetSideOrient(pzshape::TPZShapeTriang::NSides-1,sideorient);
                break;
            }
            case(EQuadrilateral)://quadrilateral
            {
                bound = new TPZCompElHDivBound2<pzshape::TPZShapeQuad>(* intel->Mesh(),gelbound);
                int sideorient = intel->GetSideOrient(side);
                TPZCompElHDivBound2<pzshape::TPZShapeQuad> *hdivbound = dynamic_cast< TPZCompElHDivBound2<pzshape::TPZShapeQuad> *>(bound);
                hdivbound->SetSideOrient(pzshape::TPZShapeQuad::NSides-1,sideorient);
                break;
            }
                
            default:
            {
                bound=0;
                std::cout << "ElementType not found!";
                DebugStop();
                break;
            }
        }
        
        int64_t sideconnectindex = intel->ConnectIndex(loccon);
        
        TPZConnect &co = bound->Connect(0);
        if(co.HasDependency()){
            if(bound->NConnects()!=1) DebugStop();
            //int64_t cindex_bound = bound->ConnectIndex(0);
            co.RemoveDepend();
        }
        bound->SetConnectIndex(0, sideconnectindex);
        //bound->Print(std::cout);
        
        TPZCompEl *newMFBound = multiMesh->CreateCompEl(gelbound);
        TPZMultiphysicsElement *locMF = dynamic_cast<TPZMultiphysicsElement *>(newMFBound);
        
        locMF->AddElement(bound, 0);
        //locMF->Print(std::cout);
        
        if(celType==EDiscontinuous){
            TPZCompElDisc *discel = dynamic_cast<TPZCompElDisc *>(mfcel->Element(1));
            locMF->AddElement(TPZCompElSide(discel,side), 1);
        }else{
            TPZInterpolationSpace *contcel = dynamic_cast<TPZInterpolationSpace *>(mfcel->Element(1));
            locMF->AddElement(TPZCompElSide(contcel,side), 1);
        }
        
        wrapEl.push_back(locMF);
    }
    
    ListGroupEl.push_back(wrapEl);
}